

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::InterfaceBlockActiveVariablesTestCase::iterate
          (InterfaceBlockActiveVariablesTestCase *this)

{
  value_type vVar1;
  Program *programDefinition;
  code *pcVar2;
  __type _Var3;
  bool bVar4;
  GLenum GVar5;
  int iVar6;
  deUint32 dVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  TestLog *pTVar9;
  size_type sVar10;
  const_reference pvVar11;
  long lVar12;
  undefined8 uVar13;
  MessageBuilder *pMVar14;
  reference pvVar15;
  reference pvVar16;
  ulong uVar17;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar18;
  const_reference ppSVar19;
  DefaultBlock *pDVar20;
  reference pvVar21;
  InternalError *this_00;
  reference pvVar22;
  undefined4 extraout_var_01;
  InterfaceBlock *extraout_RDX;
  InterfaceBlock *extraout_RDX_00;
  InterfaceBlock *interfaceBlock;
  undefined1 auVar23 [16];
  ProgramInterface local_23e8;
  ProgramInterface local_23e4;
  MessageBuilder local_23d8;
  MessageBuilder local_2258;
  MessageBuilder local_20d8;
  int local_1f54;
  long lStack_1f50;
  GLint maxNumActiveVariables;
  Functions *gl_1;
  string local_1f40;
  allocator<char> local_1f19;
  string local_1f18;
  ScopedLogSection local_1ef8;
  ScopedLogSection section_1;
  MessageBuilder local_1d70;
  MessageBuilder local_1bf0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a70;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a68;
  int local_1a5c;
  undefined1 local_1a58 [4];
  int ndx_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_18d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_18d0;
  int local_18c4;
  byte local_18bd;
  int ndx;
  undefined1 local_18b8 [3];
  bool listsIdentical;
  int varNdx_3;
  MessageBuilder builder_2;
  allocator<char> local_1719;
  string local_1718;
  int local_16f4;
  undefined1 local_16f0 [4];
  int interfaceNdx;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  referenceList;
  string blockName;
  InterfaceBlock *block;
  undefined1 local_16a8 [4];
  int varNdx_2;
  MessageBuilder builder_1;
  string local_1520 [32];
  MessageBuilder local_1500;
  MessageBuilder local_1380;
  value_type local_11f9;
  MessageBuilder local_11f8;
  undefined1 local_1078 [8];
  vector<char,_std::allocator<char>_> nameBuffer;
  GLint nameLength;
  GLenum nameProp;
  int varNdx_1;
  int varNdx;
  MessageBuilder builder;
  MessageBuilder local_d50;
  MessageBuilder local_bd0;
  int local_a4c;
  allocator<int> local_a45;
  GLint written_1;
  undefined1 local_a40 [8];
  vector<int,_std::allocator<int>_> activeVariableIndices;
  undefined1 local_a20 [4];
  GLenum props_1 [1];
  MessageBuilder local_8a0;
  MessageBuilder local_720;
  MessageBuilder local_5a0;
  int local_41c;
  int iStack_418;
  GLint written;
  GLint retBuffer [2];
  GLenum props [1];
  undefined1 local_288 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  activeResourceNames;
  GLint numActiveResources;
  GLuint resourceNdx;
  Functions *gl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  allocator<char> local_219;
  string local_218;
  ScopedLogSection local_1f8;
  ScopedLogSection section;
  int local_1e8;
  int blockNdx;
  int expectedMaxNumActiveVariables;
  ProgramSources local_1d8;
  undefined1 local_108 [8];
  ShaderProgram program;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  blockNames;
  GLenum programMemberInterfaceValue;
  GLenum programGLInterfaceValue;
  ProgramInterface programInterface;
  InterfaceBlockActiveVariablesTestCase *this_local;
  undefined4 extraout_var_00;
  
  if ((this->super_InterfaceBlockBaseCase).m_storage == STORAGE_UNIFORM) {
    local_23e4 = PROGRAMINTERFACE_UNIFORM_BLOCK;
  }
  else {
    local_23e4 = PROGRAMINTERFACE_LAST;
    if ((this->super_InterfaceBlockBaseCase).m_storage == STORAGE_BUFFER) {
      local_23e4 = PROGRAMINTERFACE_SHADER_STORAGE_BLOCK;
    }
  }
  GVar5 = getProgramInterfaceGLEnum(local_23e4);
  if ((this->super_InterfaceBlockBaseCase).m_storage == STORAGE_UNIFORM) {
    local_23e8 = 0x92e1;
  }
  else {
    local_23e8 = PROGRAMINTERFACE_UNIFORM;
    if ((this->super_InterfaceBlockBaseCase).m_storage == STORAGE_BUFFER) {
      local_23e8 = 0x92e5;
    }
  }
  getProgramInterfaceResourceList_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&program.m_program.m_info.linkTimeUs,
             (Functional *)(this->super_InterfaceBlockBaseCase).m_program,
             (Program *)(ulong)local_23e4,local_23e8);
  pRVar8 = Context::getRenderContext((this->super_InterfaceBlockBaseCase).super_TestCase.m_context);
  generateProgramInterfaceProgramSources(&local_1d8,(this->super_InterfaceBlockBaseCase).m_program);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_108,pRVar8,&local_1d8);
  glu::ProgramSources::~ProgramSources(&local_1d8);
  local_1e8 = 0;
  tcu::TestContext::setTestResult
            ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  programDefinition = (this->super_InterfaceBlockBaseCase).m_program;
  pRVar8 = Context::getRenderContext((this->super_InterfaceBlockBaseCase).super_TestCase.m_context);
  iVar6 = (*pRVar8->_vptr_RenderContext[3])();
  pTVar9 = tcu::TestContext::getLog
                     ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  checkAndLogProgram((ShaderProgram *)local_108,programDefinition,
                     (Functions *)CONCAT44(extraout_var,iVar6),pTVar9);
  section.m_log._4_4_ = 0;
  do {
    iVar6 = section.m_log._4_4_;
    sVar10 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&program.m_program.m_info.linkTimeUs);
    if ((int)sVar10 <= iVar6) {
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f18,"MaxNumActiveVariables",&local_1f19);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f40,"MAX_NUM_ACTIVE_VARIABLES",
                 (allocator<char> *)((long)&gl_1 + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_1ef8,pTVar9,&local_1f18,&local_1f40);
      std::__cxx11::string::~string((string *)&local_1f40);
      std::allocator<char>::~allocator((allocator<char> *)((long)&gl_1 + 7));
      std::__cxx11::string::~string((string *)&local_1f18);
      std::allocator<char>::~allocator(&local_1f19);
      pRVar8 = Context::getRenderContext
                         ((this->super_InterfaceBlockBaseCase).super_TestCase.m_context);
      iVar6 = (*pRVar8->_vptr_RenderContext[3])();
      lStack_1f50 = CONCAT44(extraout_var_01,iVar6);
      local_1f54 = -1;
      pcVar2 = *(code **)(lStack_1f50 + 0x990);
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_108);
      (*pcVar2)(dVar7,GVar5,0x92f7,&local_1f54);
      dVar7 = (**(code **)(lStack_1f50 + 0x800))();
      glu::checkError(dVar7,"query MAX_NUM_ACTIVE_VARIABLES",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                      ,0x7fe);
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_20d8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar14 = tcu::MessageBuilder::operator<<(&local_20d8,(char (*) [28])0xf4af94);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_1f54);
      tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_20d8);
      if (local_1e8 == local_1f54) {
        pTVar9 = tcu::TestContext::getLog
                           ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_23d8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar14 = tcu::MessageBuilder::operator<<
                            (&local_23d8,(char (*) [31])"MAX_NUM_ACTIVE_VARIABLES valid");
        tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_23d8);
      }
      else {
        pTVar9 = tcu::TestContext::getLog
                           ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_2258,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar14 = tcu::MessageBuilder::operator<<
                            (&local_2258,
                             (char (*) [47])"Error, got unexpected MAX_NUM_ACTIVE_VARIABLES");
        tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_2258);
        tcu::TestContext::setTestResult
                  ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode
                   .m_testCtx,QP_TEST_RESULT_FAIL,"unexpected MAX_NUM_ACTIVE_VARIABLES");
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_1ef8);
      retBuffer[1] = 1;
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&program.m_program.m_info.linkTimeUs);
      return STOP;
    }
    pTVar9 = tcu::TestContext::getLog
                       ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"Block",&local_219);
    pvVar11 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&program.m_program.m_info.linkTimeUs,(long)section.m_log._4_4_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gl,
                   "Block \"",pvVar11);
    std::operator+(&local_240,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gl,"\"");
    tcu::ScopedLogSection::ScopedLogSection(&local_1f8,pTVar9,&local_218,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&gl);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator(&local_219);
    pRVar8 = Context::getRenderContext
                       ((this->super_InterfaceBlockBaseCase).super_TestCase.m_context);
    iVar6 = (*pRVar8->_vptr_RenderContext[3])();
    lVar12 = CONCAT44(extraout_var_00,iVar6);
    pcVar2 = *(code **)(lVar12 + 0x9a8);
    dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_108);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&program.m_program.m_info.linkTimeUs,(long)section.m_log._4_4_);
    uVar13 = std::__cxx11::string::c_str();
    activeResourceNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (*pcVar2)(dVar7,GVar5,uVar13);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_288);
    dVar7 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar7,"query resource index",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                    ,0x72c);
    if (activeResourceNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == -1) {
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)props,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar14 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)props,
                           (char (*) [63])
                           "Error, getProgramResourceIndex returned GL_INVALID_INDEX for \"");
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&program.m_program.m_info.linkTimeUs,(long)section.m_log._4_4_);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,pvVar11);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [2])0xf09e4c);
      tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)props);
      tcu::TestContext::setTestResult
                ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Resource not found");
      retBuffer[1] = 4;
    }
    else {
      retBuffer[0] = 0x9304;
      _iStack_418 = 0xffffffffffffffff;
      local_41c = -1;
      pcVar2 = *(code **)(lVar12 + 0x9c8);
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_108);
      (*pcVar2)(dVar7,GVar5,
                activeResourceNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,1,retBuffer,1,&local_41c,
                &iStack_418);
      dVar7 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar7,"query GL_NUM_ACTIVE_VARIABLES",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                      ,0x73d);
      activeResourceNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = iStack_418;
      local_1e8 = de::max<int>(local_1e8,iStack_418);
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_5a0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar14 = tcu::MessageBuilder::operator<<(&local_5a0,(char (*) [24])0xf4b1a7);
      pMVar14 = tcu::MessageBuilder::operator<<
                          (pMVar14,(int *)&activeResourceNames.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_5a0);
      if ((local_41c == -1) || (iStack_418 == -1)) {
        pTVar9 = tcu::TestContext::getLog
                           ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_720,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar14 = tcu::MessageBuilder::operator<<
                            (&local_720,
                             (char (*) [61])
                             "Error, Query for NUM_ACTIVE_VARIABLES did not return a value");
        tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_720);
        tcu::TestContext::setTestResult
                  ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode
                   .m_testCtx,QP_TEST_RESULT_FAIL,"Query for NUM_ACTIVE_VARIABLES failed");
        retBuffer[1] = 4;
      }
      else if (written == -1) {
        if (iStack_418 < 0) {
          pTVar9 = tcu::TestContext::getLog
                             ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                              super_TestNode.m_testCtx);
          tcu::TestLog::operator<<
                    ((MessageBuilder *)local_a20,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message)
          ;
          pMVar14 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_a20,
                               (char (*) [32])"Error, NUM_ACTIVE_VARIABLES < 0");
          tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_a20);
          tcu::TestContext::setTestResult
                    ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"NUM_ACTIVE_VARIABLES < 0");
          retBuffer[1] = 4;
        }
        else {
          activeVariableIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 0x9305;
          iVar6 = (int)activeResourceNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
          written_1 = -1;
          std::allocator<int>::allocator(&local_a45);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)local_a40,(long)iVar6,&written_1,
                     &local_a45);
          std::allocator<int>::~allocator(&local_a45);
          local_a4c = -1;
          pcVar2 = *(code **)(lVar12 + 0x9c8);
          dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_108);
          iVar6 = activeResourceNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          sVar10 = std::vector<int,_std::allocator<int>_>::size
                             ((vector<int,_std::allocator<int>_> *)local_a40);
          pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_a40,0);
          (*pcVar2)(dVar7,GVar5,iVar6,1,
                    (undefined1 *)
                    ((long)&activeVariableIndices.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                    sVar10 & 0xffffffff,&local_a4c,pvVar15);
          dVar7 = (**(code **)(lVar12 + 0x800))();
          glu::checkError(dVar7,"query GL_ACTIVE_VARIABLES",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                          ,0x75f);
          if (local_a4c == -1) {
            pTVar9 = tcu::TestContext::getLog
                               ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                                super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_bd0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar14 = tcu::MessageBuilder::operator<<
                                (&local_bd0,
                                 (char (*) [63])
                                 "Error, Query for GL_ACTIVE_VARIABLES did not return any values");
            tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_bd0);
            tcu::TestContext::setTestResult
                      ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                       "Query for GL_ACTIVE_VARIABLES failed");
            retBuffer[1] = 4;
          }
          else if (local_a4c ==
                   (int)activeResourceNames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            pvVar15 = std::vector<int,_std::allocator<int>_>::back
                                ((vector<int,_std::allocator<int>_> *)local_a40);
            if (*pvVar15 == -1) {
              pTVar9 = tcu::TestContext::getLog
                                 ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase
                                  .super_TestNode.m_testCtx);
              tcu::MessageBuilder::MessageBuilder((MessageBuilder *)&varNdx_1,pTVar9);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&varNdx_1,(char (*) [27])"Active variable indices: {");
              for (nameProp = 0;
                  (int)nameProp <
                  (int)activeResourceNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage; nameProp = nameProp + 1)
              {
                if (nameProp != 0) {
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&varNdx_1,(char (*) [3])0xf95514);
                }
                pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)local_a40,
                                     (long)(int)nameProp);
                tcu::MessageBuilder::operator<<((MessageBuilder *)&varNdx_1,pvVar15);
              }
              pMVar14 = tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)&varNdx_1,(char (*) [2])0xf26f8f);
              tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&varNdx_1);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_288,
                       (long)(int)activeResourceNames.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              for (nameLength = 0;
                  nameLength <
                  (int)activeResourceNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  nameLength = nameLength + 1) {
                nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0x92f9;
                nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ =
                     0xffffffff;
                std::vector<char,_std::allocator<char>_>::vector
                          ((vector<char,_std::allocator<char>_> *)local_1078);
                local_a4c = -1;
                pcVar2 = *(code **)(lVar12 + 0x9c8);
                dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_108);
                pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)local_a40,(long)nameLength
                                    );
                (*pcVar2)(dVar7,local_23e8,*pvVar15,1,
                          &nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           field_0x14,1,&local_a4c,
                          &nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           field_0x10);
                dVar7 = (**(code **)(lVar12 + 0x800))();
                glu::checkError(dVar7,"query GL_NAME_LENGTH",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                                ,0x78e);
                if (((int)nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_
                     < 1) || (local_a4c < 1)) {
                  pTVar9 = tcu::TestContext::getLog
                                     ((this->super_InterfaceBlockBaseCase).super_TestCase.
                                      super_TestCase.super_TestNode.m_testCtx);
                  tcu::TestLog::operator<<
                            (&local_11f8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
                  pMVar14 = tcu::MessageBuilder::operator<<
                                      (&local_11f8,
                                       (char (*) [35])"Error, GL_NAME_LENGTH query failed");
                  tcu::MessageBuilder::operator<<
                            (pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  tcu::MessageBuilder::~MessageBuilder(&local_11f8);
                  tcu::TestContext::setTestResult
                            ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                             super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                             "GL_NAME_LENGTH query failed");
                  retBuffer[1] = 10;
                }
                else {
                  local_11f9 = 'X';
                  std::vector<char,_std::allocator<char>_>::resize
                            ((vector<char,_std::allocator<char>_> *)local_1078,
                             (long)(nameBuffer.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl._16_4_ + 2),&local_11f9);
                  local_a4c = -1;
                  pcVar2 = *(code **)(lVar12 + 0x9c0);
                  dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_108);
                  pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)local_a40,
                                       (long)nameLength);
                  vVar1 = *pvVar15;
                  iVar6 = nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_
                          + 1;
                  pvVar16 = std::vector<char,_std::allocator<char>_>::operator[]
                                      ((vector<char,_std::allocator<char>_> *)local_1078,0);
                  (*pcVar2)(dVar7,local_23e8,vVar1,iVar6,&local_a4c,pvVar16);
                  dVar7 = (**(code **)(lVar12 + 0x800))();
                  glu::checkError(dVar7,"getProgramResourceName",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                                  ,0x79a);
                  if (local_a4c < 1) {
                    pTVar9 = tcu::TestContext::getLog
                                       ((this->super_InterfaceBlockBaseCase).super_TestCase.
                                        super_TestCase.super_TestNode.m_testCtx);
                    tcu::TestLog::operator<<
                              (&local_1380,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
                    pMVar14 = tcu::MessageBuilder::operator<<
                                        (&local_1380,
                                         (char (*) [42])"Error, name query failed, no data written")
                    ;
                    tcu::MessageBuilder::operator<<
                              (pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
                    tcu::MessageBuilder::~MessageBuilder(&local_1380);
                    tcu::TestContext::setTestResult
                              ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"name query failed");
                    retBuffer[1] = 10;
                  }
                  else if ((int)nameBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                _16_4_ < local_a4c) {
                    pTVar9 = tcu::TestContext::getLog
                                       ((this->super_InterfaceBlockBaseCase).super_TestCase.
                                        super_TestCase.super_TestNode.m_testCtx);
                    tcu::TestLog::operator<<
                              (&local_1500,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
                    pMVar14 = tcu::MessageBuilder::operator<<
                                        (&local_1500,
                                         (char (*) [55])
                                         "Error, name query failed, query returned too much data");
                    tcu::MessageBuilder::operator<<
                              (pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
                    tcu::MessageBuilder::~MessageBuilder(&local_1500);
                    tcu::TestContext::setTestResult
                              ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"name query failed");
                    retBuffer[1] = 10;
                  }
                  else {
                    pvVar16 = std::vector<char,_std::allocator<char>_>::operator[]
                                        ((vector<char,_std::allocator<char>_> *)local_1078,0);
                    uVar17 = (ulong)local_a4c;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              (local_1520,pvVar16,uVar17,(allocator *)&builder_1.field_0x17f);
                    pvVar22 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)local_288,(long)nameLength);
                    std::__cxx11::string::operator=((string *)pvVar22,local_1520);
                    std::__cxx11::string::~string(local_1520);
                    std::allocator<char>::~allocator((allocator<char> *)&builder_1.field_0x17f);
                    retBuffer[1] = 0;
                  }
                }
                std::vector<char,_std::allocator<char>_>::~vector
                          ((vector<char,_std::allocator<char>_> *)local_1078);
              }
              pTVar9 = tcu::TestContext::getLog
                                 ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase
                                  .super_TestNode.m_testCtx);
              tcu::MessageBuilder::MessageBuilder((MessageBuilder *)local_16a8,pTVar9);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_16a8,(char (*) [19])"Active variables:\n");
              for (block._4_4_ = 0;
                  block._4_4_ <
                  (int)activeResourceNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  block._4_4_ = block._4_4_ + 1) {
                pMVar14 = tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)local_16a8,(char (*) [2])0xf2b66e);
                pvVar22 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_288,(long)block._4_4_);
                pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,pvVar22);
                tcu::MessageBuilder::operator<<(pMVar14,(char (*) [2])0xf12600);
              }
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_16a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_16a8);
              retBuffer[1] = 0;
            }
            else {
              pTVar9 = tcu::TestContext::getLog
                                 ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase
                                  .super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        ((MessageBuilder *)&builder.field_0x178,pTVar9,
                         (BeginMessageToken *)&tcu::TestLog::Message);
              pMVar14 = tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)&builder.field_0x178,
                                   (char (*) [150])
                                   "Error, GL_ACTIVE_VARIABLES query return buffer trailing guard value was modified, getProgramResourceiv returned more than NUM_ACTIVE_VARIABLES values"
                                  );
              tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&builder.field_0x178);
              tcu::TestContext::setTestResult
                        ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                         "Query for GL_ACTIVE_VARIABLES returned too many values");
              retBuffer[1] = 4;
            }
          }
          else {
            pTVar9 = tcu::TestContext::getLog
                               ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                                super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_d50,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar14 = tcu::MessageBuilder::operator<<
                                (&local_d50,
                                 (char (*) [80])
                                 "Error, Query for GL_ACTIVE_VARIABLES did not return NUM_ACTIVE_VARIABLES values"
                                );
            tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_d50);
            tcu::TestContext::setTestResult
                      ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                       "Query for GL_ACTIVE_VARIABLES returned invalid number of values");
            retBuffer[1] = 4;
          }
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)local_a40);
          if (retBuffer[1] == 0) {
            blockName.field_2._8_8_ = 0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&program.m_program.m_info.linkTimeUs,(long)section.m_log._4_4_);
            auVar23 = std::__cxx11::string::c_str();
            glu::parseVariableName_abi_cxx11_
                      ((string *)
                       &referenceList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,auVar23._0_8_,
                       auVar23._8_8_);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_16f0);
            local_16f4 = 0;
            while( true ) {
              iVar6 = local_16f4;
              pvVar18 = ProgramInterfaceDefinition::Program::getShaders
                                  ((this->super_InterfaceBlockBaseCase).m_program);
              ppSVar19 = std::
                         vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                         ::operator[](pvVar18,0);
              pDVar20 = ProgramInterfaceDefinition::Shader::getDefaultBlock(*ppSVar19);
              sVar10 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::size
                                 (&pDVar20->interfaceBlocks);
              interfaceBlock = extraout_RDX;
              if ((int)sVar10 <= iVar6) break;
              pvVar18 = ProgramInterfaceDefinition::Program::getShaders
                                  ((this->super_InterfaceBlockBaseCase).m_program);
              ppSVar19 = std::
                         vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                         ::operator[](pvVar18,0);
              pDVar20 = ProgramInterfaceDefinition::Shader::getDefaultBlock(*ppSVar19);
              pvVar21 = std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                        operator[](&pDVar20->interfaceBlocks,(long)local_16f4);
              _Var3 = std::operator==(&pvVar21->interfaceName,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&referenceList.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if (_Var3) {
                pvVar18 = ProgramInterfaceDefinition::Program::getShaders
                                    ((this->super_InterfaceBlockBaseCase).m_program);
                ppSVar19 = std::
                           vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                           ::operator[](pvVar18,0);
                pDVar20 = ProgramInterfaceDefinition::Shader::getDefaultBlock(*ppSVar19);
                blockName.field_2._8_8_ =
                     std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::
                     operator[](&pDVar20->interfaceBlocks,(long)local_16f4);
                interfaceBlock = extraout_RDX_00;
                break;
              }
              local_16f4 = local_16f4 + 1;
            }
            if (blockName.field_2._8_8_ == 0) {
              this_00 = (InternalError *)__cxa_allocate_exception(0x38);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1718,
                         "could not find block referenced in the reference resource list",
                         &local_1719);
              tcu::InternalError::InternalError(this_00,&local_1718);
              __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
            }
            getProgramInterfaceBlockMemberResourceList_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&builder_2.field_0x178,(Functional *)blockName.field_2._8_8_,
                       interfaceBlock);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_16f0,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&builder_2.field_0x178);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&builder_2.field_0x178);
            pTVar9 = tcu::TestContext::getLog
                               ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                                super_TestNode.m_testCtx);
            tcu::MessageBuilder::MessageBuilder((MessageBuilder *)local_18b8,pTVar9);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_18b8,(char (*) [26])"Expected variable names:\n");
            for (ndx = 0; iVar6 = ndx,
                sVar10 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_16f0), iVar6 < (int)sVar10; ndx = ndx + 1) {
              pMVar14 = tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_18b8,(char (*) [2])0xf2b66e);
              pvVar22 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_16f0,(long)ndx);
              pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,pvVar22);
              tcu::MessageBuilder::operator<<(pMVar14,(char (*) [2])0xf12600);
            }
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_18b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_18b8);
            local_18bd = 1;
            for (local_18c4 = 0; iVar6 = local_18c4,
                sVar10 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_16f0), iVar6 < (int)sVar10; local_18c4 = local_18c4 + 1) {
              local_18d0._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_288);
              local_18d8._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_288);
              pvVar22 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_16f0,(long)local_18c4);
              bVar4 = de::
                      contains<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                                (&local_18d0,&local_18d8,pvVar22);
              if (((bVar4 ^ 0xffU) & 1) != 0) {
                pTVar9 = tcu::TestContext::getLog
                                   ((this->super_InterfaceBlockBaseCase).super_TestCase.
                                    super_TestCase.super_TestNode.m_testCtx);
                tcu::TestLog::operator<<
                          ((MessageBuilder *)local_1a58,pTVar9,
                           (BeginMessageToken *)&tcu::TestLog::Message);
                pMVar14 = tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)local_1a58,
                                     (char (*) [59])
                                     "Error, variable name list did not contain active variable ");
                pvVar22 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_16f0,(long)local_18c4);
                pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,pvVar22);
                tcu::MessageBuilder::operator<<
                          (pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
                tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1a58);
                local_18bd = 0;
              }
            }
            for (local_1a5c = 0; iVar6 = local_1a5c,
                sVar10 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_288), iVar6 < (int)sVar10; local_1a5c = local_1a5c + 1) {
              local_1a68._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_16f0);
              local_1a70._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_16f0);
              pvVar22 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_288,(long)local_1a5c);
              bVar4 = de::
                      contains<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                                (&local_1a68,&local_1a70,pvVar22);
              if (((bVar4 ^ 0xffU) & 1) != 0) {
                pTVar9 = tcu::TestContext::getLog
                                   ((this->super_InterfaceBlockBaseCase).super_TestCase.
                                    super_TestCase.super_TestNode.m_testCtx);
                tcu::TestLog::operator<<
                          (&local_1bf0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar14 = tcu::MessageBuilder::operator<<
                                    (&local_1bf0,
                                     (char (*) [57])
                                     "Error, variable name list contains unexpected resource \"");
                pvVar22 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_288,(long)local_1a5c);
                pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,pvVar22);
                pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [2])0xf09e4c);
                tcu::MessageBuilder::operator<<
                          (pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
                tcu::MessageBuilder::~MessageBuilder(&local_1bf0);
                local_18bd = 0;
              }
            }
            if ((local_18bd & 1) == 0) {
              pTVar9 = tcu::TestContext::getLog
                                 ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase
                                  .super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        ((MessageBuilder *)&section_1,pTVar9,
                         (BeginMessageToken *)&tcu::TestLog::Message);
              pMVar14 = tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)&section_1,
                                   (char (*) [36])"Error, invalid active variable list");
              tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&section_1);
              tcu::TestContext::setTestResult
                        ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"invalid active variable list"
                        );
              retBuffer[1] = 4;
            }
            else {
              pTVar9 = tcu::TestContext::getLog
                                 ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase
                                  .super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        (&local_1d70,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar14 = tcu::MessageBuilder::operator<<
                                  (&local_1d70,(char (*) [16])"Lists identical");
              tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_1d70);
              retBuffer[1] = 0;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_16f0);
            std::__cxx11::string::~string
                      ((string *)
                       &referenceList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (retBuffer[1] == 0) {
              retBuffer[1] = 0;
            }
          }
        }
      }
      else {
        pTVar9 = tcu::TestContext::getLog
                           ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_8a0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar14 = tcu::MessageBuilder::operator<<
                            (&local_8a0,
                             (char (*) [63])
                             "Error, Query for NUM_ACTIVE_VARIABLES returned too many values");
        tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_8a0);
        tcu::TestContext::setTestResult
                  ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode
                   .m_testCtx,QP_TEST_RESULT_FAIL,
                   "Query for NUM_ACTIVE_VARIABLES returned too many values");
        retBuffer[1] = 4;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_288);
    tcu::ScopedLogSection::~ScopedLogSection(&local_1f8);
    section.m_log._4_4_ = section.m_log._4_4_ + 1;
  } while( true );
}

Assistant:

InterfaceBlockActiveVariablesTestCase::IterateResult InterfaceBlockActiveVariablesTestCase::iterate (void)
{
	const ProgramInterface			programInterface				= (m_storage == glu::STORAGE_UNIFORM) ? (PROGRAMINTERFACE_UNIFORM_BLOCK) :
																	  (m_storage == glu::STORAGE_BUFFER) ? (PROGRAMINTERFACE_SHADER_STORAGE_BLOCK) :
																	  (PROGRAMINTERFACE_LAST);
	const glw::GLenum				programGLInterfaceValue			= getProgramInterfaceGLEnum(programInterface);
	const glw::GLenum				programMemberInterfaceValue		= (m_storage == glu::STORAGE_UNIFORM) ? (GL_UNIFORM) :
																	  (m_storage == glu::STORAGE_BUFFER) ? (GL_BUFFER_VARIABLE) :
																	  (0);
	const std::vector<std::string>	blockNames						= getProgramInterfaceResourceList(m_program, programInterface);
	glu::ShaderProgram				program							(m_context.getRenderContext(), generateProgramInterfaceProgramSources(m_program));
	int								expectedMaxNumActiveVariables	= 0;

	DE_ASSERT(programInterface != PROGRAMINTERFACE_LAST);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	checkAndLogProgram(program, m_program, m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	// Verify all blocks

	for (int blockNdx = 0; blockNdx < (int)blockNames.size(); ++blockNdx)
	{
		const tcu::ScopedLogSection section				(m_testCtx.getLog(), "Block", "Block \"" + blockNames[blockNdx] + "\"");
		const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
		const glw::GLuint			resourceNdx			= gl.getProgramResourceIndex(program.getProgram(), programGLInterfaceValue, blockNames[blockNdx].c_str());
		glw::GLint					numActiveResources;
		std::vector<std::string>	activeResourceNames;

		GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

		if (resourceNdx == GL_INVALID_INDEX)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, getProgramResourceIndex returned GL_INVALID_INDEX for \"" << blockNames[blockNdx] << "\"" << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Resource not found");
			continue;
		}

		// query block information

		{
			const glw::GLenum	props[]			= { GL_NUM_ACTIVE_VARIABLES };
			glw::GLint			retBuffer[2]	= { -1, -1 };
			glw::GLint			written			= -1;

			gl.getProgramResourceiv(program.getProgram(), programGLInterfaceValue, resourceNdx, DE_LENGTH_OF_ARRAY(props), props, 1, &written, retBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query GL_NUM_ACTIVE_VARIABLES");

			numActiveResources = retBuffer[0];
			expectedMaxNumActiveVariables = de::max(expectedMaxNumActiveVariables, numActiveResources);
			m_testCtx.getLog() << tcu::TestLog::Message << "NUM_ACTIVE_VARIABLES = " << numActiveResources << tcu::TestLog::EndMessage;

			if (written == -1 || retBuffer[0] == -1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, Query for NUM_ACTIVE_VARIABLES did not return a value" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Query for NUM_ACTIVE_VARIABLES failed");
				continue;
			}
			else if (retBuffer[1] != -1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, Query for NUM_ACTIVE_VARIABLES returned too many values" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Query for NUM_ACTIVE_VARIABLES returned too many values");
				continue;
			}
			else if (retBuffer[0] < 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, NUM_ACTIVE_VARIABLES < 0" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "NUM_ACTIVE_VARIABLES < 0");
				continue;
			}
		}

		// query block variable information

		{
			const glw::GLenum			props[]					= { GL_ACTIVE_VARIABLES };
			std::vector<glw::GLint>		activeVariableIndices	(numActiveResources + 1, -1);	// Allocate one extra trailing to detect wrong write lengths
			glw::GLint					written					= -1;

			gl.getProgramResourceiv(program.getProgram(), programGLInterfaceValue, resourceNdx, DE_LENGTH_OF_ARRAY(props), props, (glw::GLsizei)activeVariableIndices.size(), &written, &activeVariableIndices[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query GL_ACTIVE_VARIABLES");

			if (written == -1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, Query for GL_ACTIVE_VARIABLES did not return any values" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Query for GL_ACTIVE_VARIABLES failed");
				continue;
			}
			else if (written != numActiveResources)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, Query for GL_ACTIVE_VARIABLES did not return NUM_ACTIVE_VARIABLES values" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Query for GL_ACTIVE_VARIABLES returned invalid number of values");
				continue;
			}
			else if (activeVariableIndices.back() != -1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, GL_ACTIVE_VARIABLES query return buffer trailing guard value was modified, getProgramResourceiv returned more than NUM_ACTIVE_VARIABLES values" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Query for GL_ACTIVE_VARIABLES returned too many values");
				continue;
			}

			// log indices
			{
				tcu::MessageBuilder builder(&m_testCtx.getLog());

				builder << "Active variable indices: {";
				for (int varNdx = 0; varNdx < numActiveResources; ++varNdx)
				{
					if (varNdx)
						builder << ", ";
					builder << activeVariableIndices[varNdx];
				}
				builder << "}" << tcu::TestLog::EndMessage;
			}

			// collect names

			activeResourceNames.resize(numActiveResources);

			for (int varNdx = 0; varNdx < numActiveResources; ++varNdx)
			{
				const glw::GLenum	nameProp	= GL_NAME_LENGTH;
				glw::GLint			nameLength	= -1;
				std::vector<char>	nameBuffer;

				written = -1;
				gl.getProgramResourceiv(program.getProgram(), programMemberInterfaceValue, activeVariableIndices[varNdx], 1, &nameProp, 1, &written, &nameLength);
				GLU_EXPECT_NO_ERROR(gl.getError(), "query GL_NAME_LENGTH");

				if (nameLength <= 0 || written <= 0)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, GL_NAME_LENGTH query failed" << tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "GL_NAME_LENGTH query failed");
					continue;
				}

				nameBuffer.resize(nameLength + 2, 'X'); // allocate more than required
				written = -1;
				gl.getProgramResourceName(program.getProgram(), programMemberInterfaceValue, activeVariableIndices[varNdx], nameLength+1, &written, &nameBuffer[0]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "getProgramResourceName");

				if (written <= 0)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, name query failed, no data written" << tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "name query failed");
					continue;
				}
				else if (written > nameLength)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, name query failed, query returned too much data" << tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "name query failed");
					continue;
				}

				activeResourceNames[varNdx] = std::string(&nameBuffer[0], written);
			}

			// log collected names
			{
				tcu::MessageBuilder builder(&m_testCtx.getLog());

				builder << "Active variables:\n";
				for (int varNdx = 0; varNdx < numActiveResources; ++varNdx)
					builder << "\t" << activeResourceNames[varNdx] << "\n";
				builder << tcu::TestLog::EndMessage;
			}
		}

		// verify names
		{
			glu::InterfaceBlock*		block		= DE_NULL;
			const std::string			blockName	= glu::parseVariableName(blockNames[blockNdx].c_str());
			std::vector<std::string>	referenceList;

			for (int interfaceNdx = 0; interfaceNdx < (int)m_program->getShaders()[0]->getDefaultBlock().interfaceBlocks.size(); ++interfaceNdx)
			{
				if (m_program->getShaders()[0]->getDefaultBlock().interfaceBlocks[interfaceNdx].interfaceName == blockName)
				{
					block = &m_program->getShaders()[0]->getDefaultBlock().interfaceBlocks[interfaceNdx];
					break;
				}
			}

			if (!block)
				throw tcu::InternalError("could not find block referenced in the reference resource list");

			// generate reference list

			referenceList = getProgramInterfaceBlockMemberResourceList(*block);
			{
				tcu::MessageBuilder builder(&m_testCtx.getLog());

				builder << "Expected variable names:\n";
				for (int varNdx = 0; varNdx < (int)referenceList.size(); ++varNdx)
					builder << "\t" << referenceList[varNdx] << "\n";
				builder << tcu::TestLog::EndMessage;
			}

			// compare lists
			{
				bool listsIdentical = true;

				for (int ndx = 0; ndx < (int)referenceList.size(); ++ndx)
				{
					if (!de::contains(activeResourceNames.begin(), activeResourceNames.end(), referenceList[ndx]))
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Error, variable name list did not contain active variable " << referenceList[ndx] << tcu::TestLog::EndMessage;
						listsIdentical = false;
					}
				}

				for (int ndx = 0; ndx < (int)activeResourceNames.size(); ++ndx)
				{
					if (!de::contains(referenceList.begin(), referenceList.end(), activeResourceNames[ndx]))
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Error, variable name list contains unexpected resource \"" << activeResourceNames[ndx] << "\"" << tcu::TestLog::EndMessage;
						listsIdentical = false;
					}
				}

				if (listsIdentical)
					m_testCtx.getLog() << tcu::TestLog::Message << "Lists identical" << tcu::TestLog::EndMessage;
				else
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Error, invalid active variable list" << tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "invalid active variable list");
					continue;
				}
			}
		}
	}

	// Max num active variables
	{
		const tcu::ScopedLogSection	section					(m_testCtx.getLog(), "MaxNumActiveVariables", "MAX_NUM_ACTIVE_VARIABLES");
		const glw::Functions&		gl						= m_context.getRenderContext().getFunctions();
		glw::GLint					maxNumActiveVariables	= -1;

		gl.getProgramInterfaceiv(program.getProgram(), programGLInterfaceValue, GL_MAX_NUM_ACTIVE_VARIABLES, &maxNumActiveVariables);
		GLU_EXPECT_NO_ERROR(gl.getError(), "query MAX_NUM_ACTIVE_VARIABLES");

		m_testCtx.getLog() << tcu::TestLog::Message << "MAX_NUM_ACTIVE_VARIABLES = " << maxNumActiveVariables << tcu::TestLog::EndMessage;

		if (expectedMaxNumActiveVariables != maxNumActiveVariables)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, got unexpected MAX_NUM_ACTIVE_VARIABLES" << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "unexpected MAX_NUM_ACTIVE_VARIABLES");
		}
		else
			m_testCtx.getLog() << tcu::TestLog::Message << "MAX_NUM_ACTIVE_VARIABLES valid" << tcu::TestLog::EndMessage;
	}

	return STOP;
}